

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O2

void __thiscall
AddrManImpl::Unserialize<HashVerifier<AutoFile>>(AddrManImpl *this,HashVerifier<AutoFile> *s_)

{
  uint256 *this_00;
  int *fmt;
  int *fmt_00;
  unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
  *this_01;
  unordered_map<CService,_long,_CServiceHash,_std::equal_to<CService>,_std::allocator<std::pair<const_CService,_long>_>_>
  *this_02;
  mapped_type mVar1;
  long lVar2;
  _Hash_node_base *p_Var3;
  string msg;
  pointer ppVar4;
  bool bVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  Network NVar8;
  int iVar9;
  uint uVar10;
  uint32_t uVar11;
  _Node_const_iterator<std::pair<const_long,_AddrInfo>,_false,_false> __tmp;
  mapped_type *pmVar12;
  mapped_type *pmVar13;
  mapped_type *pmVar14;
  nid_type *pnVar15;
  _Hash_node_base *p_Var16;
  InvalidAddrManVersionError *this_03;
  string *psVar17;
  pointer ppVar18;
  char *s_00;
  int *args_1;
  int n;
  int iVar19;
  long lVar20;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  AddrManImpl *pAVar21;
  AddrManImpl *this_04;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  int iVar22;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 uVar23;
  undefined4 in_stack_fffffffffffffe4c;
  _Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_05;
  undefined8 in_stack_fffffffffffffe50;
  vector<long,_std::allocator<long>_> *this_06;
  nid_type (*panVar24) [64];
  int check_code;
  int nLostUnk;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> bucket_entries;
  int nLost;
  uint8_t lowest_compatible;
  uint8_t compat;
  ParamsStream<HashVerifier<AutoFile>_&,_CAddress::SerParams> s;
  SerParams ser_params;
  Format format;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock1;
  string local_118;
  uint256 serialized_asmap_checksum;
  uint256 supplied_asmap_checksum;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  args_1 = (int *)0xe9;
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock1,&this->cs,"cs",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
             ,0xe9,false);
  if ((this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    __assert_fail("vRandom.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
                  ,0xeb,"void AddrManImpl::Unserialize(Stream &) [Stream = HashVerifier<AutoFile>]")
    ;
  }
  supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems._0_8_ = &format;
  Wrapper<CustomUintFormatter<1,false>,AddrManImpl::Format&>::Unserialize<HashVerifier<AutoFile>>
            ((Wrapper<CustomUintFormatter<1,false>,AddrManImpl::Format&> *)&supplied_asmap_checksum,
             s_);
  ser_params._1_7_ = 0;
  ser_params.super_SerParams.enc._0_1_ = V2_ASMAP < format;
  s.m_params = &ser_params;
  s.m_substream = s_;
  compat = ser_readdata8<ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>>(&s);
  if (compat < 0x20) {
    psVar17 = (string *)__cxa_allocate_exception(0x20);
    tinyformat::format<unsigned_char,unsigned_char>
              ((string *)&supplied_asmap_checksum,
               (tinyformat *)
               "Corrupted addrman database: The compat value (%u) is lower than the expected minimum value %u."
               ,(char *)&compat," m_banned_mutex",(uchar *)args_1);
    std::ios_base::failure[abi:cxx11]::failure(psVar17);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(psVar17,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
    goto LAB_006afef6;
  }
  lowest_compatible = compat - 0x20;
  if (4 < lowest_compatible) {
    this_03 = (InvalidAddrManVersionError *)__cxa_allocate_exception(0x20);
    supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0] = format;
    serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0] = '\x04';
    tinyformat::format<unsigned_char,unsigned_char,char[13],unsigned_char>
              (&local_58,
               (tinyformat *)
               "Unsupported format of addrman database: %u. It is compatible with formats >=%u, but the maximum supported by this version of %s is %u."
               ,(char *)&supplied_asmap_checksum,&lowest_compatible,(uchar *)"Bitcoin Core",
               (char (*) [13])&serialized_asmap_checksum,(uchar *)this);
    msg._M_string_length._0_4_ = in_stack_fffffffffffffe40;
    msg._M_dataplus._M_p = (pointer)this;
    msg._M_string_length._4_4_ = in_stack_fffffffffffffe44;
    msg.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffe48;
    msg.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffe4c;
    msg.field_2._8_8_ = in_stack_fffffffffffffe50;
    InvalidAddrManVersionError::InvalidAddrManVersionError(this_03,msg);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(this_03,&InvalidAddrManVersionError::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
    goto LAB_006afef6;
  }
  this_00 = &this->nKey;
  base_blob<256u>::Unserialize<ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>>
            ((base_blob<256u> *)this_00,&s);
  uVar6 = ser_readdata32<ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>>(&s);
  this->nNew = uVar6;
  uVar6 = ser_readdata32<ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>>(&s);
  fmt = &this->nTried;
  *fmt = uVar6;
  pAVar21 = this;
  uVar7 = ser_readdata32<ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>>(&s);
  fmt_00 = &this->nNew;
  uVar6 = uVar7 ^ 0x40000000;
  if (format == V0_HISTORICAL) {
    uVar6 = uVar7;
  }
  uVar10 = *fmt_00;
  if (0x10000 < uVar10) {
    psVar17 = (string *)__cxa_allocate_exception(0x20);
    serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[2] = '\x01';
    serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    tinyformat::format<int,int>
              ((string *)&supplied_asmap_checksum,
               (tinyformat *)"Corrupt AddrMan serialization: nNew=%d, should be in [0, %d]",
               (char *)fmt_00,(int *)&serialized_asmap_checksum,args_1);
    std::ios_base::failure[abi:cxx11]::failure(psVar17);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(psVar17,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
    goto LAB_006afef6;
  }
  if (0x4000 < (uint)*fmt) {
    psVar17 = (string *)__cxa_allocate_exception(0x20);
    serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[1] = '@';
    serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    tinyformat::format<int,int>
              ((string *)&supplied_asmap_checksum,
               (tinyformat *)"Corrupt AddrMan serialization: nTried=%d, should be in [0, %d]",
               (char *)fmt,(int *)&serialized_asmap_checksum,args_1);
    std::ios_base::failure[abi:cxx11]::failure(psVar17);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(psVar17,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
    goto LAB_006afef6;
  }
  this_06 = &pAVar21->vRandom;
  this_01 = &pAVar21->mapInfo;
  this_02 = &pAVar21->mapAddr;
  this_05 = (_Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             *)&pAVar21->m_network_counts;
  for (lVar20 = 0; lVar20 < (int)uVar10; lVar20 = lVar20 + 1) {
    supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems._0_8_ = lVar20;
    pmVar12 = std::__detail::
              _Map_base<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_01,(key_type *)&supplied_asmap_checksum);
    AddrInfo::
    SerializationOps<ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>,AddrInfo,ActionUnserialize>
              (pmVar12,&s);
    pmVar13 = std::__detail::
              _Map_base<CService,_std::pair<const_CService,_long>,_std::allocator<std::pair<const_CService,_long>_>,_std::__detail::_Select1st,_std::equal_to<CService>,_CServiceHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<CService,_std::pair<const_CService,_long>,_std::allocator<std::pair<const_CService,_long>_>,_std::__detail::_Select1st,_std::equal_to<CService>,_CServiceHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_02,(key_type *)pmVar12);
    *pmVar13 = lVar20;
    pmVar12->nRandomPos =
         (int)((ulong)((long)(pAVar21->vRandom).super__Vector_base<long,_std::allocator<long>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(pAVar21->vRandom).super__Vector_base<long,_std::allocator<long>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 3);
    supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems._0_8_ = lVar20;
    std::vector<long,_std::allocator<long>_>::emplace_back<long>
              (this_06,(long *)&supplied_asmap_checksum);
    NVar8 = CNetAddr::GetNetwork((CNetAddr *)pmVar12);
    supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0] = (char)NVar8;
    supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[1] = (char)(NVar8 >> 8);
    supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[2] = (char)(NVar8 >> 0x10);
    supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[3] = (char)(NVar8 >> 0x18);
    pmVar14 = std::__detail::
              _Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[](this_05,(key_type *)&supplied_asmap_checksum);
    pmVar14->n_new = pmVar14->n_new + 1;
    uVar10 = *fmt_00;
  }
  pAVar21->nIdCount = (long)(int)uVar10;
  nLost = 0;
  pnVar15 = &pAVar21->nIdCount;
  iVar22 = 0;
  iVar19 = 0;
  this_04 = pAVar21;
  while( true ) {
    if (*fmt <= iVar19) break;
    AddrInfo::AddrInfo((AddrInfo *)&supplied_asmap_checksum);
    AddrInfo::
    SerializationOps<ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>,AddrInfo,ActionUnserialize>
              ((AddrInfo *)&supplied_asmap_checksum,&s);
    iVar9 = AddrInfo::GetTriedBucket
                      ((AddrInfo *)&supplied_asmap_checksum,this_00,this_04->m_netgroupman);
    uVar10 = AddrInfo::GetBucketPosition((AddrInfo *)&supplied_asmap_checksum,this_00,false,iVar9);
    bVar5 = CNetAddr::IsValid((CNetAddr *)&supplied_asmap_checksum);
    if (bVar5) {
      lVar20 = (ulong)(uint)(iVar9 << 9) + 0x178;
      if (*(long *)((long)pAVar21->vvTried[0] + (ulong)uVar10 * 8 + lVar20 + -0x178) != -1)
      goto LAB_006af6cf;
      _GLOBAL__N_1::std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)this_06,pnVar15);
      pmVar12 = std::__detail::
                _Map_base<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)this_01,pnVar15);
      AddrInfo::operator=(pmVar12,(AddrInfo *)&supplied_asmap_checksum);
      mVar1 = *pnVar15;
      pmVar13 = std::__detail::
                _Map_base<CService,_std::pair<const_CService,_long>,_std::allocator<std::pair<const_CService,_long>_>,_std::__detail::_Select1st,_std::equal_to<CService>,_CServiceHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<CService,_std::pair<const_CService,_long>,_std::allocator<std::pair<const_CService,_long>_>,_std::__detail::_Select1st,_std::equal_to<CService>,_CServiceHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)this_02,(key_type *)&supplied_asmap_checksum);
      *pmVar13 = mVar1;
      lVar2 = *pnVar15;
      *(long *)((long)pAVar21->vvTried[0] + (ulong)uVar10 * 8 + lVar20 + -0x178) = lVar2;
      *pnVar15 = lVar2 + 1;
      NVar8 = CNetAddr::GetNetwork((CNetAddr *)&supplied_asmap_checksum);
      serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0] = (char)NVar8;
      serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[1] = (char)(NVar8 >> 8);
      serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[2] = (char)(NVar8 >> 0x10);
      serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[3] = (char)(NVar8 >> 0x18);
      pmVar14 = std::__detail::
                _Map_base<Network,_std::pair<const_Network,_AddrManImpl::NewTriedCount>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>,_std::__detail::_Select1st,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[](this_05,(key_type *)&serialized_asmap_checksum);
      pmVar14->n_tried = pmVar14->n_tried + 1;
    }
    else {
LAB_006af6cf:
      iVar22 = iVar22 + 1;
      nLost = iVar22;
    }
    AddrInfo::~AddrInfo((AddrInfo *)&supplied_asmap_checksum);
    iVar19 = iVar19 + 1;
  }
  *fmt = *fmt - iVar22;
  bucket_entries.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bucket_entries.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bucket_entries.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar19 = 0;
  while (supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0] = (char)iVar19,
        supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[1] = (char)((uint)iVar19 >> 8)
        , supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[2] =
               (char)((uint)iVar19 >> 0x10),
        supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems[3] =
             (char)((uint)iVar19 >> 0x18), iVar19 < (int)uVar6) {
    uVar7 = ser_readdata32<ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>>(&s);
    if ((int)uVar7 < 1) {
      uVar7 = 0;
    }
    while (bVar5 = uVar7 != 0, uVar7 = uVar7 - 1, bVar5) {
      serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems._0_8_ =
           serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems._0_8_ &
           0xffffffff00000000;
      uVar11 = ser_readdata32<ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>>(&s);
      serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0] = (char)uVar11;
      serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[1] = (char)(uVar11 >> 8);
      serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[2] = (char)(uVar11 >> 0x10);
      serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[3] = (char)(uVar11 >> 0x18);
      if ((-1 < (int)uVar11) && ((int)uVar11 < *fmt_00)) {
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int&>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&bucket_entries,
                   (int *)&supplied_asmap_checksum,(int *)&serialized_asmap_checksum);
      }
    }
    iVar19 = supplied_asmap_checksum.super_base_blob<256U>.m_data._M_elems._0_4_ + 1;
  }
  s_00 = (char *)this_04->m_netgroupman;
  NetGroupManager::GetAsmapChecksum(&supplied_asmap_checksum,(NetGroupManager *)s_00);
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  serialized_asmap_checksum.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  if (V1_DETERMINISTIC < format) {
    s_00 = (char *)&s;
    base_blob<256u>::Unserialize<ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>>
              ((base_blob<256u> *)&serialized_asmap_checksum,
               (ParamsStream<HashVerifier<AutoFile>_&,_CAddress::SerParams> *)s_00);
  }
  if (uVar6 == 0x400) {
    s_00 = (char *)&supplied_asmap_checksum;
    bVar5 = ::operator==(&serialized_asmap_checksum.super_base_blob<256U>,(base_blob<256U> *)s_00);
    uVar23 = 1;
    if (!bVar5) goto LAB_006af89d;
  }
  else {
LAB_006af89d:
    bVar5 = ::LogAcceptCategory(ADDRMAN,(Level)s_00);
    if (bVar5) {
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
      ;
      source_file._M_len = 0x5b;
      logging_function._M_str = "Unserialize";
      logging_function._M_len = 0xb;
      s_00 = "Unserialize";
      LogPrintFormatInternal<>
                (logging_function,source_file,0x159,ADDRMAN,Debug,
                 (ConstevalFormatString<0U>)0xc8c2fb);
    }
    uVar23 = 0;
  }
  ppVar4 = bucket_entries.
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  panVar24 = this_04->vvNew;
  for (ppVar18 = bucket_entries.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppVar18 != ppVar4; ppVar18 = ppVar18 + 1)
  {
    iVar19 = ppVar18->first;
    iVar9 = ppVar18->second;
    s_00 = (char *)&local_118;
    local_118._M_dataplus._M_p = (pointer)(long)iVar9;
    pmVar12 = std::__detail::
              _Map_base<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this_01,(key_type *)&local_118);
    bVar5 = CNetAddr::IsValid((CNetAddr *)pmVar12);
    if ((bVar5) && (pmVar12->nRefCount < 8)) {
      s_00 = (char *)this_00;
      uVar10 = AddrInfo::GetBucketPosition(pmVar12,this_00,true,iVar19);
      if ((char)uVar23 == '\0') {
LAB_006af979:
        iVar19 = AddrInfo::GetNewBucket(pmVar12,this_00,this_04->m_netgroupman);
        s_00 = (char *)this_00;
        uVar10 = AddrInfo::GetBucketPosition(pmVar12,this_00,true,iVar19);
        if (panVar24[iVar19][uVar10] != -1) goto LAB_006af9cc;
        pnVar15 = panVar24[iVar19] + uVar10;
      }
      else {
        if (panVar24[iVar19][uVar10] != -1) goto LAB_006af979;
        pnVar15 = panVar24[iVar19] + uVar10;
      }
      *pnVar15 = (nid_type)(long)iVar9;
      pmVar12->nRefCount = pmVar12->nRefCount + 1;
    }
LAB_006af9cc:
  }
  nLostUnk = 0;
  iVar19 = 0;
  p_Var16 = (this_04->mapInfo)._M_h._M_before_begin._M_nxt;
  while (p_Var16 != (_Hash_node_base *)0x0) {
    if ((*(char *)&p_Var16[0x11]._M_nxt == '\0') && (*(int *)((long)&p_Var16[0x10]._M_nxt + 4) == 0)
       ) {
      p_Var3 = p_Var16->_M_nxt;
      s_00 = (char *)p_Var16[1]._M_nxt;
      Delete(this_04,(nid_type)s_00);
      iVar19 = iVar19 + 1;
      p_Var16 = p_Var3;
      nLostUnk = iVar19;
    }
    else {
      p_Var16 = p_Var16->_M_nxt;
    }
  }
  if (iVar19 + iVar22 != 0 && SCARRY4(iVar19,iVar22) == iVar19 + iVar22 < 0) {
    bVar5 = ::LogAcceptCategory(ADDRMAN,(Level)s_00);
    if (bVar5) {
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
      ;
      source_file_00._M_len = 0x5b;
      logging_function_00._M_str = "Unserialize";
      logging_function_00._M_len = 0xb;
      LogPrintFormatInternal<int,int>
                (logging_function_00,source_file_00,0x186,ADDRMAN,Debug,
                 (ConstevalFormatString<2U>)0xc8c341,&nLostUnk,&nLost);
    }
  }
  check_code = CheckAddrman(this_04);
  if (check_code == 0) {
    std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
              (&bucket_entries.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
    std::unique_lock<std::mutex>::~unique_lock(&criticalblock1.super_unique_lock);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else {
    psVar17 = (string *)__cxa_allocate_exception(0x20);
    tinyformat::format<int>
              (&local_118,"Corrupt data. Consistency check failed with code %s",&check_code);
    std::ios_base::failure[abi:cxx11]::failure(psVar17);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(psVar17,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
LAB_006afef6:
  __stack_chk_fail();
}

Assistant:

void AddrManImpl::Unserialize(Stream& s_)
{
    LOCK(cs);

    assert(vRandom.empty());

    Format format;
    s_ >> Using<CustomUintFormatter<1>>(format);

    const auto ser_params = (format >= Format::V3_BIP155 ? CAddress::V2_DISK : CAddress::V1_DISK);
    ParamsStream s{s_, ser_params};

    uint8_t compat;
    s >> compat;
    if (compat < INCOMPATIBILITY_BASE) {
        throw std::ios_base::failure(strprintf(
            "Corrupted addrman database: The compat value (%u) "
            "is lower than the expected minimum value %u.",
            compat, INCOMPATIBILITY_BASE));
    }
    const uint8_t lowest_compatible = compat - INCOMPATIBILITY_BASE;
    if (lowest_compatible > FILE_FORMAT) {
        throw InvalidAddrManVersionError(strprintf(
            "Unsupported format of addrman database: %u. It is compatible with formats >=%u, "
            "but the maximum supported by this version of %s is %u.",
            uint8_t{format}, lowest_compatible, PACKAGE_NAME, uint8_t{FILE_FORMAT}));
    }

    s >> nKey;
    s >> nNew;
    s >> nTried;
    int nUBuckets = 0;
    s >> nUBuckets;
    if (format >= Format::V1_DETERMINISTIC) {
        nUBuckets ^= (1 << 30);
    }

    if (nNew > ADDRMAN_NEW_BUCKET_COUNT * ADDRMAN_BUCKET_SIZE || nNew < 0) {
        throw std::ios_base::failure(
                strprintf("Corrupt AddrMan serialization: nNew=%d, should be in [0, %d]",
                    nNew,
                    ADDRMAN_NEW_BUCKET_COUNT * ADDRMAN_BUCKET_SIZE));
    }

    if (nTried > ADDRMAN_TRIED_BUCKET_COUNT * ADDRMAN_BUCKET_SIZE || nTried < 0) {
        throw std::ios_base::failure(
                strprintf("Corrupt AddrMan serialization: nTried=%d, should be in [0, %d]",
                    nTried,
                    ADDRMAN_TRIED_BUCKET_COUNT * ADDRMAN_BUCKET_SIZE));
    }

    // Deserialize entries from the new table.
    for (int n = 0; n < nNew; n++) {
        AddrInfo& info = mapInfo[n];
        s >> info;
        mapAddr[info] = n;
        info.nRandomPos = vRandom.size();
        vRandom.push_back(n);
        m_network_counts[info.GetNetwork()].n_new++;
    }
    nIdCount = nNew;

    // Deserialize entries from the tried table.
    int nLost = 0;
    for (int n = 0; n < nTried; n++) {
        AddrInfo info;
        s >> info;
        int nKBucket = info.GetTriedBucket(nKey, m_netgroupman);
        int nKBucketPos = info.GetBucketPosition(nKey, false, nKBucket);
        if (info.IsValid()
                && vvTried[nKBucket][nKBucketPos] == -1) {
            info.nRandomPos = vRandom.size();
            info.fInTried = true;
            vRandom.push_back(nIdCount);
            mapInfo[nIdCount] = info;
            mapAddr[info] = nIdCount;
            vvTried[nKBucket][nKBucketPos] = nIdCount;
            nIdCount++;
            m_network_counts[info.GetNetwork()].n_tried++;
        } else {
            nLost++;
        }
    }
    nTried -= nLost;

    // Store positions in the new table buckets to apply later (if possible).
    // An entry may appear in up to ADDRMAN_NEW_BUCKETS_PER_ADDRESS buckets,
    // so we store all bucket-entry_index pairs to iterate through later.
    std::vector<std::pair<int, int>> bucket_entries;

    for (int bucket = 0; bucket < nUBuckets; ++bucket) {
        int num_entries{0};
        s >> num_entries;
        for (int n = 0; n < num_entries; ++n) {
            int entry_index{0};
            s >> entry_index;
            if (entry_index >= 0 && entry_index < nNew) {
                bucket_entries.emplace_back(bucket, entry_index);
            }
        }
    }

    // If the bucket count and asmap checksum haven't changed, then attempt
    // to restore the entries to the buckets/positions they were in before
    // serialization.
    uint256 supplied_asmap_checksum{m_netgroupman.GetAsmapChecksum()};
    uint256 serialized_asmap_checksum;
    if (format >= Format::V2_ASMAP) {
        s >> serialized_asmap_checksum;
    }
    const bool restore_bucketing{nUBuckets == ADDRMAN_NEW_BUCKET_COUNT &&
        serialized_asmap_checksum == supplied_asmap_checksum};

    if (!restore_bucketing) {
        LogDebug(BCLog::ADDRMAN, "Bucketing method was updated, re-bucketing addrman entries from disk\n");
    }

    for (auto bucket_entry : bucket_entries) {
        int bucket{bucket_entry.first};
        const int entry_index{bucket_entry.second};
        AddrInfo& info = mapInfo[entry_index];

        // Don't store the entry in the new bucket if it's not a valid address for our addrman
        if (!info.IsValid()) continue;

        // The entry shouldn't appear in more than
        // ADDRMAN_NEW_BUCKETS_PER_ADDRESS. If it has already, just skip
        // this bucket_entry.
        if (info.nRefCount >= ADDRMAN_NEW_BUCKETS_PER_ADDRESS) continue;

        int bucket_position = info.GetBucketPosition(nKey, true, bucket);
        if (restore_bucketing && vvNew[bucket][bucket_position] == -1) {
            // Bucketing has not changed, using existing bucket positions for the new table
            vvNew[bucket][bucket_position] = entry_index;
            ++info.nRefCount;
        } else {
            // In case the new table data cannot be used (bucket count wrong or new asmap),
            // try to give them a reference based on their primary source address.
            bucket = info.GetNewBucket(nKey, m_netgroupman);
            bucket_position = info.GetBucketPosition(nKey, true, bucket);
            if (vvNew[bucket][bucket_position] == -1) {
                vvNew[bucket][bucket_position] = entry_index;
                ++info.nRefCount;
            }
        }
    }

    // Prune new entries with refcount 0 (as a result of collisions or invalid address).
    int nLostUnk = 0;
    for (auto it = mapInfo.cbegin(); it != mapInfo.cend(); ) {
        if (it->second.fInTried == false && it->second.nRefCount == 0) {
            const auto itCopy = it++;
            Delete(itCopy->first);
            ++nLostUnk;
        } else {
            ++it;
        }
    }
    if (nLost + nLostUnk > 0) {
        LogDebug(BCLog::ADDRMAN, "addrman lost %i new and %i tried addresses due to collisions or invalid addresses\n", nLostUnk, nLost);
    }

    const int check_code{CheckAddrman()};
    if (check_code != 0) {
        throw std::ios_base::failure(strprintf(
            "Corrupt data. Consistency check failed with code %s",
            check_code));
    }
}